

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O1

int check_child(int ppri,AssocKind passoc,int cpri,AssocKind cassoc,int left,int right)

{
  AssocKind AVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  
  iVar2 = 1;
  if (((cassoc | passoc) & 4) == ASSOC_NONE) {
    AVar1 = (uint)(left != 0);
    if ((passoc & 0x10) == ASSOC_NONE) {
      AVar1 = passoc & 1 ^ 3;
    }
    uVar4 = 0;
    uVar3 = 2 - (ulong)(cassoc & 1);
    if ((cassoc & 0x10) != ASSOC_NONE) {
      uVar3 = uVar4;
    }
    if ((cpri <= ppri) && (uVar4 = 1, ppri <= cpri)) {
      uVar4 = (ulong)((cassoc & 2) + (passoc >> 1 & 1) + 2);
    }
    iVar2 = child_table[AVar1][uVar3][uVar4];
  }
  return iVar2;
}

Assistant:

static int check_child(int ppri, AssocKind passoc, int cpri, AssocKind cassoc, int left, int right) {
  if (IS_NARY_ASSOC(cassoc) || IS_NARY_ASSOC(passoc)) return 1;
  uint p = IS_BINARY_NARY_ASSOC(passoc) ? (right ? 1 : 0) : (IS_LEFT_ASSOC(passoc) ? 2 : 3);
  uint c = IS_BINARY_NARY_ASSOC(cassoc) ? 0 : (IS_LEFT_ASSOC(cassoc) ? 1 : 2);
  uint r =
      cpri > ppri ? 0 : (cpri < ppri ? 1 : (2 + ((IS_RIGHT_ASSOC(cassoc) ? 2 : 0) + (IS_RIGHT_ASSOC(passoc) ? 1 : 0))));
  (void)left;
  return child_table[p][c][r];
}